

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O3

void __thiscall
HighsCliqueTable::rebuild
          (HighsCliqueTable *this,HighsInt ncols,HighsPostsolveStack *postSolveStack,
          HighsDomain *globaldomain,vector<int,_std::allocator<int>_> *orig2reducedcol,
          vector<int,_std::allocator<int>_> *orig2reducedrow)

{
  CliqueVar *pCVar1;
  double dVar2;
  uint uVar3;
  ulong uVar4;
  pointer pCVar5;
  int iVar6;
  HighsInt numcliquevars;
  long lVar7;
  ulong uVar8;
  pointer pCVar9;
  CliqueVar CVar10;
  int iVar11;
  long lVar12;
  pointer pCVar13;
  pointer pCVar14;
  CliqueVar *pCVar15;
  ulong uVar16;
  HighsCliqueTable newCliqueTable;
  HighsCliqueTable HStack_218;
  
  HighsCliqueTable(&HStack_218,ncols);
  HStack_218.inPresolve = this->inPresolve;
  HStack_218.minEntriesForParallelism = this->minEntriesForParallelism;
  uVar4 = ((long)(this->cliques).
                 super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->cliques).
                 super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333;
  if ((int)uVar4 != 0) {
    uVar16 = 0;
    do {
      pCVar5 = (this->cliques).
               super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar11 = pCVar5[uVar16].start;
      lVar7 = (long)iVar11;
      if (lVar7 != -1) {
        iVar6 = iVar11;
        if (iVar11 != pCVar5[uVar16].end) {
          do {
            pCVar14 = (this->cliqueentries).
                      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            CVar10 = pCVar14[lVar7];
            uVar3 = (orig2reducedcol->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start[(uint)CVar10 & 0x7fffffff];
            lVar12 = (long)(int)uVar3;
            if (((((lVar12 == -1) ||
                  ((globaldomain->mipsolver->model_->integrality_).
                   super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar12] == kContinuous)) ||
                 (dVar2 = (globaldomain->col_lower_).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar12], dVar2 != 0.0)) ||
                ((NAN(dVar2) ||
                 (dVar2 = (globaldomain->col_upper_).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar12], dVar2 != 1.0)))) ||
               ((NAN(dVar2) ||
                ((postSolveStack->linearlyTransformable).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar12] == '\0')))) {
              CVar10 = (CliqueVar)((uint)CVar10 | 0x7fffffff);
            }
            else {
              CVar10 = (CliqueVar)((uint)CVar10 & 0x80000000 | uVar3 & 0x7fffffff);
            }
            pCVar14[lVar7] = CVar10;
            lVar7 = lVar7 + 1;
            pCVar5 = (this->cliques).
                     super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            iVar11 = pCVar5[uVar16].end;
          } while ((int)lVar7 != iVar11);
          iVar6 = pCVar5[uVar16].start;
        }
        pCVar13 = (this->cliqueentries).
                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar7 = (long)iVar6;
        pCVar14 = pCVar13 + lVar7;
        pCVar1 = pCVar13 + iVar11;
        uVar8 = (long)iVar11 * 4 + lVar7 * -4;
        if (0 < (long)uVar8 >> 4) {
          pCVar14 = (pointer)((long)&pCVar14->field_0x0 + (uVar8 & 0xfffffffffffffff0));
          lVar12 = ((long)uVar8 >> 4) + 1;
          pCVar9 = pCVar13 + lVar7 + 2;
          do {
            if ((~(uint)pCVar9[-2] & 0x7fffffff) == 0) {
              pCVar9 = pCVar9 + -2;
              goto LAB_002638d5;
            }
            if ((~(uint)pCVar9[-1] & 0x7fffffff) == 0) {
              pCVar9 = pCVar9 + -1;
              goto LAB_002638d5;
            }
            if ((~(uint)*pCVar9 & 0x7fffffff) == 0) goto LAB_002638d5;
            if ((~(uint)pCVar9[1] & 0x7fffffff) == 0) {
              pCVar9 = pCVar9 + 1;
              goto LAB_002638d5;
            }
            lVar12 = lVar12 + -1;
            pCVar9 = pCVar9 + 4;
          } while (1 < lVar12);
          uVar8 = (long)pCVar1 - (long)pCVar14;
        }
        lVar7 = (long)uVar8 >> 2;
        if (lVar7 == 1) {
LAB_002638ac:
          pCVar9 = pCVar14;
          if ((~(uint)*pCVar14 & 0x7fffffff) != 0) {
            pCVar9 = pCVar1;
          }
LAB_002638d5:
          if ((pCVar9 != pCVar1) && (pCVar15 = pCVar9 + 1, pCVar15 != pCVar1)) {
            do {
              if ((~(uint)*pCVar15 & 0x7fffffff) != 0) {
                *pCVar9 = *pCVar15;
                pCVar9 = pCVar9 + 1;
              }
              pCVar15 = pCVar15 + 1;
            } while (pCVar15 != pCVar1);
            pCVar13 = (this->cliqueentries).
                      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pCVar5 = (this->cliques).
                     super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          }
        }
        else {
          if (lVar7 == 2) {
LAB_0026389b:
            pCVar9 = pCVar14;
            if ((~(uint)*pCVar14 & 0x7fffffff) != 0) {
              pCVar14 = pCVar14 + 1;
              goto LAB_002638ac;
            }
            goto LAB_002638d5;
          }
          pCVar9 = pCVar1;
          if (lVar7 == 3) {
            pCVar9 = pCVar14;
            if ((~(uint)*pCVar14 & 0x7fffffff) != 0) {
              pCVar14 = pCVar14 + 1;
              goto LAB_0026389b;
            }
            goto LAB_002638d5;
          }
        }
        numcliquevars =
             (HighsInt)((ulong)((long)pCVar9 - (long)(pCVar13 + pCVar5[uVar16].start)) >> 2);
        if (1 < numcliquevars) {
          doAddClique(&HStack_218,pCVar13 + pCVar5[uVar16].start,numcliquevars,false,
                      (uint)(pCVar5[uVar16].origin != 0x7fffffff) << 0x1f | 0x7fffffff);
        }
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != (uVar4 & 0xffffffff));
  }
  operator=(this,&HStack_218);
  ~HighsCliqueTable(&HStack_218);
  return;
}

Assistant:

void HighsCliqueTable::rebuild(
    HighsInt ncols, const presolve::HighsPostsolveStack& postSolveStack,
    const HighsDomain& globaldomain,
    const std::vector<HighsInt>& orig2reducedcol,
    const std::vector<HighsInt>& orig2reducedrow) {
  HighsCliqueTable newCliqueTable(ncols);
  newCliqueTable.setPresolveFlag(inPresolve);
  newCliqueTable.setMinEntriesForParallelism(minEntriesForParallelism);
  HighsInt ncliques = cliques.size();
  for (HighsInt i = 0; i != ncliques; ++i) {
    if (cliques[i].start == -1) continue;

    for (HighsInt k = cliques[i].start; k != cliques[i].end; ++k) {
      HighsInt col = orig2reducedcol[cliqueentries[k].col];

      if (col == -1 || !globaldomain.isBinary(col) ||
          !postSolveStack.isColLinearlyTransformable(col))
        cliqueentries[k].col = kHighsIInf;
      else
        cliqueentries[k].col = col;
    }

    auto newend =
        std::remove_if(cliqueentries.begin() + cliques[i].start,
                       cliqueentries.begin() + cliques[i].end,
                       [](CliqueVar v) { return v.col == kHighsIInf; });
    HighsInt numvars = newend - (cliqueentries.begin() + cliques[i].start);
    // since we do not know how variables in the clique that have been deleted
    // are replaced (i.e. are they fixed to 0 or 1, or substituted) we relax
    // them out which means the equality status needs to be set to false
    if (numvars <= 1) continue;

    HighsInt origin = cliques[i].origin != kHighsIInf ? -1 : kHighsIInf;
    newCliqueTable.doAddClique(&cliqueentries[cliques[i].start], numvars, false,
                               origin);
  }

  *this = std::move(newCliqueTable);
}